

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O1

void testTranslationRotationMatrix<double>(M44d *mat)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  void *pvVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> to;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> from;
  M44d m1;
  M44d m2;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> local_208;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> local_1e8;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  Vec3<double> local_198;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  double dStack_140;
  undefined1 local_138 [16];
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double local_80;
  double local_78;
  double dStack_70;
  double local_68;
  double local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing known translate/rotate matrix:\n ",0x28);
  Imath_3_2::operator<<((ostream *)&std::cout,mat);
  if (testTranslationRotationMatrix<double>(Imath_3_2::Matrix44<double>const&)::rand == '\0') {
    testTranslationRotationMatrix<double>();
  }
  local_1e8.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::reserve
            (&local_1e8,7);
  local_208.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = 7;
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::reserve
            (&local_208,7);
  do {
    dVar7 = (double)Imath_3_2::erand48(testTranslationRotationMatrix<double>::rand._state);
    dVar8 = (double)Imath_3_2::erand48(testTranslationRotationMatrix<double>::rand._state);
    dVar9 = (double)Imath_3_2::erand48(testTranslationRotationMatrix<double>::rand._state);
    local_168 = mat->x[0][0];
    dStack_160 = mat->x[0][1];
    local_178 = mat->x[1][0];
    dStack_170 = mat->x[1][1];
    local_148 = mat->x[2][0];
    dStack_140 = mat->x[2][1];
    dVar2 = mat->x[3][0];
    dVar3 = mat->x[3][1];
    local_1b8 = mat->x[0][2];
    local_1c8 = mat->x[1][2];
    local_1c0 = mat->x[2][2];
    dVar10 = mat->x[3][2];
    local_1a0 = mat->x[0][3];
    local_1b0 = mat->x[1][3];
    local_1a8 = mat->x[2][3];
    local_158 = mat->x[3][3];
    uStack_150 = 0;
    local_138._8_8_ = dVar8;
    local_138._0_8_ = dVar7;
    local_128 = dVar9;
    std::vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>>::
    emplace_back<Imath_3_2::Vec3<double>>
              ((vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>> *)&local_1e8
               ,(Vec3<double> *)local_138);
    auVar11._0_8_ = local_158 + local_1a8 * dVar9 + local_1a0 * dVar7 + local_1b0 * dVar8;
    local_128 = (dVar10 + local_1c0 * dVar9 + local_1b8 * dVar7 + local_1c8 * dVar8) / auVar11._0_8_
    ;
    auVar13._0_8_ = dVar2 + dVar9 * local_148 + dVar7 * local_168 + dVar8 * local_178;
    auVar13._8_8_ = dVar3 + dVar9 * dStack_140 + dVar7 * dStack_160 + dVar8 * dStack_170;
    auVar11._8_8_ = auVar11._0_8_;
    local_138 = divpd(auVar13,auVar11);
    std::vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>>::
    emplace_back<Imath_3_2::Vec3<double>>
              ((vector<Imath_3_2::Vec3<double>,std::allocator<Imath_3_2::Vec3<double>>> *)&local_208
               ,(Vec3<double> *)local_138);
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  pvVar5 = operator_new(0x38);
  auVar11 = _DAT_00166210;
  auVar13 = _DAT_00166200;
  lVar6 = 0;
  do {
    auVar14._8_4_ = (int)lVar6;
    auVar14._0_8_ = lVar6;
    auVar14._12_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar14 = (auVar14 | auVar13) ^ auVar11;
    if (auVar14._4_4_ == -0x80000000 && auVar14._0_4_ < -0x7ffffff9) {
      *(undefined8 *)((long)pvVar5 + lVar6 * 8) = 0x3ff0000000000000;
      *(undefined8 *)((long)pvVar5 + lVar6 * 8 + 8) = 0x3ff0000000000000;
    }
    lVar6 = lVar6 + 2;
  } while (lVar6 != 8);
  Imath_3_2::procrustesRotationAndTranslation<double>
            ((Vec3 *)local_138,
             (Vec3 *)local_1e8.
                     super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             &(local_208.
               super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->x,(ulong)pvVar5,true);
  Imath_3_2::procrustesRotationAndTranslation<double>
            ((Vec3 *)&local_b8,
             (Vec3 *)local_1e8.
                     super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             (ulong)local_208.
                    super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,true);
  lVar6 = 0x10;
  while( true ) {
    dVar10 = *(double *)
              ((long)local_1e8.
                     super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x10);
    dVar2 = *(double *)
             ((long)local_1e8.
                    super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar6 + -8);
    dVar3 = *(double *)
             ((long)&(local_1e8.
                      super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->x + lVar6);
    dVar7 = *(double *)
             ((long)&(local_208.
                      super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->x + lVar6);
    dVar16 = dStack_e0 * dVar3 + dStack_120 * dVar10 + dStack_100 * dVar2 + dStack_c0;
    auVar15._8_8_ = dVar16;
    auVar15._0_8_ = dVar16;
    pdVar1 = (double *)
             ((long)local_208.
                    super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar6 + -0x10);
    dVar8 = *pdVar1;
    dVar9 = pdVar1[1];
    auVar19._0_8_ = local_78 * dVar3 + local_b8 * dVar10 + local_98 * dVar2 + local_58;
    auVar19._8_8_ = dStack_70 * dVar3 + dStack_b0 * dVar10 + dStack_90 * dVar2 + dStack_50;
    dVar17 = local_68 * dVar3 + local_a8 * dVar10 + local_88 * dVar2 + local_48;
    dVar18 = dVar3 * local_60 + dVar10 * local_a0 + dVar2 * local_80 + local_40;
    local_198.z = dVar7 - (local_e8 * dVar3 + local_128 * dVar10 + local_108 * dVar2 + local_c8) /
                          dVar16;
    auVar12._0_8_ =
         dVar3 * local_f8 + dVar10 * (double)local_138._0_8_ + dVar2 * local_118 + local_d8;
    auVar12._8_8_ =
         dVar3 * dStack_f0 + dVar10 * (double)local_138._8_8_ + dVar2 * dStack_110 + dStack_d0;
    auVar13 = divpd(auVar12,auVar15);
    local_198.x = dVar8 - auVar13._0_8_;
    local_198.y = dVar9 - auVar13._8_8_;
    dVar10 = local_198.z * local_198.z + local_198.x * local_198.x + local_198.y * local_198.y;
    if (dVar10 < 4.450147717014403e-308) {
      dVar10 = Imath_3_2::Vec3<double>::lengthTiny(&local_198);
    }
    else if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    if (1e-08 <= dVar10) {
      __assert_fail("(b - b1).length () < eps",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                    ,0x3b,"void testTranslationRotationMatrix(const Imath_3_2::M44d &) [T = double]"
                   );
    }
    auVar4._8_8_ = dVar18;
    auVar4._0_8_ = dVar18;
    auVar13 = divpd(auVar19,auVar4);
    local_198.x = dVar8 - auVar13._0_8_;
    local_198.y = dVar9 - auVar13._8_8_;
    local_198.z = dVar7 - dVar17 / dVar18;
    dVar10 = local_198.z * local_198.z + local_198.x * local_198.x + local_198.y * local_198.y;
    if (dVar10 < 4.450147717014403e-308) {
      dVar10 = Imath_3_2::Vec3<double>::lengthTiny(&local_198);
    }
    else if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    if (1e-08 <= dVar10) break;
    lVar6 = lVar6 + 0x18;
    if (lVar6 == 0xb8) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  OK\n",5);
      operator_delete(pvVar5,0x38);
      if (local_208.
          super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.
                        super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_208.
                              super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.
                              super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1e8.
          super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.
                        super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1e8.
                              super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.
                              super__Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  __assert_fail("(b - b2).length () < eps",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                ,0x3c,"void testTranslationRotationMatrix(const Imath_3_2::M44d &) [T = double]");
}

Assistant:

void
testTranslationRotationMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& mat)
{
    std::cout << "Testing known translate/rotate matrix:\n " << mat;
    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> Vec;

    static IMATH_INTERNAL_NAMESPACE::Rand48 rand (2047);

    size_t           numPoints = 7;
    std::vector<Vec> from;
    from.reserve (numPoints);
    std::vector<Vec> to;
    to.reserve (numPoints);
    for (size_t i = 0; i < numPoints; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d a (
            rand.nextf (), rand.nextf (), rand.nextf ());
        IMATH_INTERNAL_NAMESPACE::V3d b = a * mat;

        from.push_back (Vec (a));
        to.push_back (Vec (b));
    }

    std::vector<T>                       weights (numPoints, T (1));
    const IMATH_INTERNAL_NAMESPACE::M44d m1 = procrustesRotationAndTranslation (
        &from[0], &to[0], &weights[0], numPoints);
    const IMATH_INTERNAL_NAMESPACE::M44d m2 =
        procrustesRotationAndTranslation (&from[0], &to[0], numPoints);

    const T eps = sizeof (T) == 8 ? T(1e-8) : T(1e-4);
    for (size_t i = 0; i < numPoints; ++i)
    {
        const IMATH_INTERNAL_NAMESPACE::V3d a  = from[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b  = to[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b1 = a * m1;
        const IMATH_INTERNAL_NAMESPACE::V3d b2 = a * m2;

        assert ((b - b1).length () < eps);
        assert ((b - b2).length () < eps);
    }
    std::cout << "  OK\n";
}